

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O3

int __thiscall trun::Process_Unix::ConsumePipes(Process_Unix *this,ProcessCallbackBase *callback)

{
  int iVar1;
  ssize_t sVar2;
  long *plVar3;
  long *plVar4;
  initializer_list<pollfd> __l;
  string buffer;
  vector<pollfd,_std::allocator<pollfd>_> plist;
  allocator_type local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  vector<pollfd,_std::allocator<pollfd>_> local_88;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  pollfd local_30;
  int local_28;
  undefined4 local_24;
  
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_a8,0x400,' ');
  local_30.fd = this->pipe_stdout[0];
  local_30.events = 1;
  local_30.revents = 0;
  local_28 = this->pipe_stderr[0];
  local_24 = 1;
  __l._M_len = 2;
  __l._M_array = &local_30;
  std::vector<pollfd,_std::allocator<pollfd>_>::vector(&local_88,__l,&local_a9);
  iVar1 = poll((pollfd *)
               local_88.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
               super__Vector_impl_data._M_start,
               (long)local_88.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_88.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3,0);
  if (((local_88.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data
       ._M_start)->revents & 1) == 0) {
    if ((((pollfd *)
         (local_88.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
          super__Vector_impl_data._M_start + 1))->revents & 1) == 0) goto LAB_00170fe5;
    sVar2 = read(this->pipe_stderr[0],local_a8._M_dataplus._M_p,local_a8._M_string_length);
    local_a8._M_dataplus._M_p[(int)sVar2] = '\0';
    plVar4 = local_60;
    local_70[0] = plVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,local_a8._M_dataplus._M_p,
               local_a8._M_dataplus._M_p + local_a8._M_string_length);
    (*(callback->super_ProcessCallbackInterface)._vptr_ProcessCallbackInterface[3])
              (callback,local_70);
    plVar3 = local_70[0];
  }
  else {
    sVar2 = read(this->pipe_stdout[0],local_a8._M_dataplus._M_p,local_a8._M_string_length);
    local_a8._M_dataplus._M_p[(int)sVar2] = '\0';
    plVar4 = local_40;
    local_50[0] = plVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,local_a8._M_dataplus._M_p,
               local_a8._M_dataplus._M_p + local_a8._M_string_length);
    (*(callback->super_ProcessCallbackInterface)._vptr_ProcessCallbackInterface[2])
              (callback,local_50);
    plVar3 = local_50[0];
  }
  if (plVar3 != plVar4) {
    operator_delete(plVar3,*plVar4 + 1);
  }
LAB_00170fe5:
  if (local_88.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  return iVar1;
}

Assistant:

int Process_Unix::ConsumePipes(ProcessCallbackBase *callback) {

	std::string buffer(1024,' ');
	std::vector<pollfd> plist = { {pipe_stdout[0],POLLIN, 0}, {pipe_stderr[0],POLLIN, 0} };
	int rval=poll(&plist[0],plist.size(),/*timeout*/0);
    if ( plist[0].revents&POLLIN) {
      int bytes_read = read(pipe_stdout[0], &buffer[0], buffer.length());
      // cout << "read " << bytes_read << " bytes from stdout.\n";
      // cout << buffer.substr(0, static_cast<size_t>(bytes_read)) << "\n";
	  buffer[bytes_read] = '\0';
      callback->OnStdOutData(buffer);
    }
    else if ( plist[1].revents&POLLIN ) {
      int bytes_read = read(pipe_stderr[0], &buffer[0], buffer.length());
      // cout << "read " << bytes_read << " bytes from stderr.\n";
      // cout << buffer.substr(0, static_cast<size_t>(bytes_read)) << "\n";
	  buffer[bytes_read] = '\0';
      callback->OnStdErrData(buffer);
    }
	return rval;

}